

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O0

void __thiscall Clasp::Clause::reason(Clause *this,Solver *s,Literal p,LitVec *out)

{
  bool bVar1;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_RCX;
  long in_RDI;
  LitRange LVar2;
  Literal *r_1;
  Literal *r;
  LitRange t;
  Literal *in_stack_ffffffffffffff68;
  Literal *in_stack_ffffffffffffff70;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_stack_ffffffffffffff78;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_stack_ffffffffffffff80;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *this_00;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  Solver *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  Literal in_stack_ffffffffffffffb4;
  Solver *in_stack_ffffffffffffffb8;
  LitRange local_40;
  Solver *pSStack_38;
  
  Clasp::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  Literal::operator~(in_stack_ffffffffffffff68);
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
            (in_stack_ffffffffffffff80,(Literal *)in_stack_ffffffffffffff78);
  bVar1 = isSentinel((Literal)0x0);
  LVar2 = local_40;
  if (!bVar1) {
    this_00 = in_RCX;
    Literal::operator~(in_stack_ffffffffffffff68);
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
              (this_00,(Literal *)in_stack_ffffffffffffff78);
    LVar2 = tail((Clause *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    for (in_stack_ffffffffffffffb8 = (Solver *)LVar2.first; pSStack_38 = (Solver *)LVar2.second,
        in_stack_ffffffffffffffb8 != pSStack_38;
        in_stack_ffffffffffffffb8 = (Solver *)&in_stack_ffffffffffffffb8->field_0x4) {
      in_stack_ffffffffffffff78 = in_RCX;
      in_stack_ffffffffffffffb4 = Literal::operator~(in_stack_ffffffffffffff68);
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                (this_00,(Literal *)in_stack_ffffffffffffff78);
    }
    bVar1 = contracted((Clause *)0x22d037);
    if (bVar1) {
      do {
        Literal::operator~(in_stack_ffffffffffffff68);
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  (this_00,(Literal *)in_stack_ffffffffffffff78);
        in_stack_ffffffffffffffa8 = (Solver *)&pSStack_38->field_0x4;
        bVar1 = Literal::flagged((Literal *)pSStack_38);
        pSStack_38 = in_stack_ffffffffffffffa8;
      } while (((bVar1 ^ 0xffU) & 1) != 0);
    }
  }
  local_40 = LVar2;
  bVar1 = ClauseHead::learnt((ClauseHead *)0x22d098);
  if (bVar1) {
    ConstraintInfo::score((ConstraintInfo *)(in_RDI + 0x10));
    Solver::updateOnReason
              (in_stack_ffffffffffffffb8,
               (ConstraintScore *)CONCAT44(in_stack_ffffffffffffffb4.rep_,in_stack_ffffffffffffffb0)
               ,local_40.first._0_4_,(LitVec *)in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

void Clause::reason(Solver& s, Literal p, LitVec& out) {
	out.push_back(~head_[p == head_[0]]);
	if (!isSentinel(head_[2])) {
		out.push_back(~head_[2]);
		LitRange t = tail();
		for (const Literal* r = t.first; r != t.second; ++r) {
			out.push_back(~*r);
		}
		if (contracted()) {
			const Literal* r = t.second;
			do { out.push_back(~*r); } while (!r++->flagged());
		}
	}
	if (learnt()) {
		s.updateOnReason(info_.score(), p, out);
	}
}